

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O2

uint64_t farmhash64_xo(char *s,size_t len)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t in_R8;
  long lVar4;
  size_t len_00;
  
  if (0x20 < len) {
    if (len < 0x41) {
      len_00 = len * 2 + 0x9ae16a3b2f904031;
      uVar1 = farmhash_xo_h32(s,0x9ae16a3b2f904031,0,0,in_R8);
      uVar2 = farmhash_xo_h32(s + (len - 0x20),len_00,0,0,in_R8);
      lVar4 = uVar2 * len_00 + uVar1;
    }
    else {
      if (0x60 < len) {
        if (len < 0x101) {
          uVar1 = farmhash64_na(s,len);
          return uVar1;
        }
        uVar1 = farmhash64_uo(s,len);
        return uVar1;
      }
      len_00 = len * 2 + 0x9ae16a3b2f903fdd;
      uVar1 = farmhash_xo_h32(s,0x9ae16a3b2f903fdd,0,0,in_R8);
      uVar2 = farmhash_xo_h32(s + 0x20,len_00,0,0,in_R8);
      uVar3 = farmhash_xo_h32(s + (len - 0x20),len_00,uVar1,uVar2,in_R8);
      lVar4 = (uVar2 >> 0x15) + (uVar1 >> 0x11) + uVar3 * 9;
    }
    return lVar4 * len_00;
  }
  if (len < 0x11) {
    uVar1 = farmhash_na_len_0_to_16(s,len);
    return uVar1;
  }
  uVar1 = farmhash_na_len_17_to_32(s,len);
  return uVar1;
}

Assistant:

uint64_t farmhash64_xo(const char *s, size_t len) {
  if (len <= 32) {
    if (len <= 16) {
      return farmhash_na_len_0_to_16(s, len);
    } else {
      return farmhash_na_len_17_to_32(s, len);
    }
  } else if (len <= 64) {
    return farmhash_xo_len_33_to_64(s, len);
  } else if (len <= 96) {
    return farmhash_xo_len_65_to_96(s, len);
  } else if (len <= 256) {
    return farmhash64_na(s, len);
  } else {
    return farmhash64_uo(s, len);
  }
}